

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.hpp
# Opt level: O0

void __thiscall Analyser::Static::Oric::Target::Target(Target *this)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  Target *local_10;
  Target *this_local;
  
  local_10 = this;
  Static::Target::Target(&this->super_Target,Oric);
  Reflection::StructImpl<Analyser::Static::Oric::Target>::StructImpl
            (&this->super_StructImpl<Analyser::Static::Oric::Target>);
  (this->super_Target)._vptr_Target = (_func_int **)&PTR__Target_00c94528;
  (this->super_StructImpl<Analyser::Static::Oric::Target>).super_Struct._vptr_Struct =
       (_func_int **)&DAT_00c94548;
  this->rom = BASIC11;
  this->disk_interface = None;
  this->processor = MOS6502;
  std::__cxx11::string::string((string *)&this->loading_command);
  this->should_start_jasmin = false;
  bVar1 = Reflection::StructImpl<Analyser::Static::Oric::Target>::needs_declare
                    (&this->super_StructImpl<Analyser::Static::Oric::Target>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"rom",&local_41);
    Reflection::StructImpl<Analyser::Static::Oric::Target>::
    declare<Analyser::Static::Oric::Target::ROM>
              (&this->super_StructImpl<Analyser::Static::Oric::Target>,&this->rom,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"disk_interface",&local_69);
    Reflection::StructImpl<Analyser::Static::Oric::Target>::
    declare<Analyser::Static::Oric::Target::DiskInterface>
              (&this->super_StructImpl<Analyser::Static::Oric::Target>,&this->disk_interface,
               &local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"processor",&local_91);
    Reflection::StructImpl<Analyser::Static::Oric::Target>::
    declare<Analyser::Static::Oric::Target::Processor>
              (&this->super_StructImpl<Analyser::Static::Oric::Target>,&this->processor,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    Reflection::Enum::declare<Analyser::Static::Oric::Target::ROM>
              ("ROM","BASIC10, BASIC11, Pravetz");
    Reflection::Enum::declare<Analyser::Static::Oric::Target::DiskInterface>
              ("DiskInterface","None, Microdisc, Pravetz, Jasmin, BD500");
    Reflection::Enum::declare<Analyser::Static::Oric::Target::Processor>
              ("Processor","MOS6502, WDC65816");
  }
  return;
}

Assistant:

Target(): Analyser::Static::Target(Machine::Oric) {
		if(needs_declare()) {
			DeclareField(rom);
			DeclareField(disk_interface);
			DeclareField(processor);
			AnnounceEnum(ROM);
			AnnounceEnum(DiskInterface);
			AnnounceEnum(Processor);
		}
	}